

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageHsv.cpp
# Opt level: O1

void __thiscall AlgorithmAreaAverageHsv::Iterate(AlgorithmAreaAverageHsv *this)

{
  QImage *image;
  QRgb b;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  QRgb QVar5;
  undefined4 uVar6;
  QRgb a;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  qulonglong _t1;
  int iVar11;
  AlgorithmBase *this_00;
  QImage *pQVar12;
  QPoint bLoc;
  QPoint aLoc;
  QPoint local_78;
  AlgorithmBase *local_70;
  undefined4 local_64;
  undefined4 local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  QRgb local_50;
  QRgb local_4c;
  QRgb local_48;
  QRgb local_44;
  QPoint local_40;
  QImage *local_38;
  
  image = &(this->super_AlgorithmBase).allRgb_;
  local_38 = &(this->super_AlgorithmBase).target_;
  iVar10 = 100000;
  local_70 = &this->super_AlgorithmBase;
  do {
    iVar1 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    uVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    local_40.xp = iVar1;
    local_40.yp = uVar2;
    iVar3 = AlgorithmBase::RandomNumber(local_70,0,0xfff);
    this_00 = local_70;
    uVar4 = AlgorithmBase::RandomNumber(local_70,0,0xfff);
    local_78.xp = iVar3;
    local_78.yp = uVar4;
    QVar5 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_00,image,&local_40,3);
    local_44 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_00,image,&local_78,3);
    pQVar12 = local_38;
    local_48 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_00,local_38,&local_40,3);
    local_4c = GetAverageColourInArea((AlgorithmAreaAverageHsv *)this_00,pQVar12,&local_78,3);
    iVar11 = (int)image;
    uVar6 = QImage::pixel(iVar11,iVar1);
    local_64 = QImage::pixel(iVar11,iVar3);
    this = (AlgorithmAreaAverageHsv *)local_70;
    local_54 = uVar2;
    QImage::setPixel(iVar11,iVar1,uVar2);
    pQVar12 = image;
    local_60 = uVar6;
    local_5c = uVar4;
    local_58 = iVar3;
    QImage::setPixel(iVar11,iVar3,uVar4);
    a = GetAverageColourInArea((AlgorithmAreaAverageHsv *)pQVar12,image,&local_40,3);
    local_50 = GetAverageColourInArea((AlgorithmAreaAverageHsv *)pQVar12,image,&local_78,3);
    b = local_48;
    iVar3 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar5,local_48);
    QVar5 = local_4c;
    iVar7 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,local_44,local_4c);
    iVar8 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,b);
    iVar9 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,local_50,QVar5);
    if (iVar9 + iVar8 < iVar7 + iVar3) {
      (this->super_AlgorithmBase).improvements_ = (this->super_AlgorithmBase).improvements_ + 1;
    }
    else {
      QImage::setPixel(iVar11,iVar1,local_54);
      QImage::setPixel(iVar11,local_58,local_5c);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  _t1 = (this->super_AlgorithmBase).iterations_ + 100000;
  (this->super_AlgorithmBase).iterations_ = _t1;
  AlgorithmBase::onIterationsChanged(&this->super_AlgorithmBase,_t1);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmAreaAverageHsv::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        const int areaSize = 3;
        QRgb hsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb hsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);
        QRgb targetA = GetAverageColourInArea(target_, aLoc, areaSize);
        QRgb targetB = GetAverageColourInArea(target_, bLoc, areaSize);

        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);
        allRgb_.setPixel(aLoc, b);
        allRgb_.setPixel(bLoc, a);
        QRgb swappedHsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb swappedHsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);

        int aDifference = ColourDifference(hsvA, targetA);
        int bDifference = ColourDifference(hsvB, targetB);

        int aSwappedDifference = ColourDifference(swappedHsvA, targetA);
        int bSwappedDifference = ColourDifference(swappedHsvB, targetB);

       if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
           // Already swapped the pixels!
           ++improvements_;
       } else {
           // Swap back if we need to
           allRgb_.setPixel(aLoc, a);
           allRgb_.setPixel(bLoc, b);
       }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}